

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void allocate_mc_tmp_buf(AV1_COMMON *cm,ThreadData *thread_data,int buf_size,int use_highbd)

{
  bool bVar1;
  uint8_t *puVar2;
  CONV_BUF_TYPE *pCVar3;
  size_t size;
  bool bVar4;
  long lVar5;
  
  size = (size_t)buf_size;
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    puVar2 = (uint8_t *)aom_memalign(0x10,size);
    if (use_highbd == 0) {
      thread_data->mc_buf[lVar5] = puVar2;
      if (puVar2 == (uint8_t *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate thread_data->mc_buf[ref]");
        puVar2 = thread_data->mc_buf[lVar5];
      }
      memset(puVar2,0,size);
    }
    else {
      if (puVar2 == (uint8_t *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate hbd_mc_buf");
      }
      memset(puVar2,0,size);
      thread_data->mc_buf[lVar5] = (uint8_t *)((ulong)puVar2 >> 1);
    }
    lVar5 = 1;
    bVar1 = false;
  } while (bVar4);
  thread_data->mc_buf_size = buf_size;
  thread_data->mc_buf_use_highbd = use_highbd;
  pCVar3 = (CONV_BUF_TYPE *)aom_memalign(0x20,0x8000);
  thread_data->tmp_conv_dst = pCVar3;
  if (pCVar3 == (CONV_BUF_TYPE *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate thread_data->tmp_conv_dst")
    ;
  }
  puVar2 = (uint8_t *)aom_memalign(0x10,0x8000);
  thread_data->seg_mask = puVar2;
  if (puVar2 == (uint8_t *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate thread_data->seg_mask");
  }
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    puVar2 = (uint8_t *)aom_memalign(0x10,0x18000);
    thread_data->tmp_obmc_bufs[lVar5] = puVar2;
    if (puVar2 == (uint8_t *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate thread_data->tmp_obmc_bufs[i]");
    }
    lVar5 = 1;
    bVar1 = false;
  } while (bVar4);
  return;
}

Assistant:

static inline void allocate_mc_tmp_buf(AV1_COMMON *const cm,
                                       ThreadData *thread_data, int buf_size,
                                       int use_highbd) {
  for (int ref = 0; ref < 2; ref++) {
    // The mc_buf/hbd_mc_buf must be zeroed to fix a intermittent valgrind error
    // 'Conditional jump or move depends on uninitialised value' from the loop
    // filter. Uninitialized reads in convolve function (e.g. horiz_4tap path in
    // av1_convolve_2d_sr_avx2()) from mc_buf/hbd_mc_buf are seen to be the
    // potential reason for this issue.
    if (use_highbd) {
      uint16_t *hbd_mc_buf;
      CHECK_MEM_ERROR(cm, hbd_mc_buf, (uint16_t *)aom_memalign(16, buf_size));
      memset(hbd_mc_buf, 0, buf_size);
      thread_data->mc_buf[ref] = CONVERT_TO_BYTEPTR(hbd_mc_buf);
    } else {
      CHECK_MEM_ERROR(cm, thread_data->mc_buf[ref],
                      (uint8_t *)aom_memalign(16, buf_size));
      memset(thread_data->mc_buf[ref], 0, buf_size);
    }
  }
  thread_data->mc_buf_size = buf_size;
  thread_data->mc_buf_use_highbd = use_highbd;

  CHECK_MEM_ERROR(cm, thread_data->tmp_conv_dst,
                  aom_memalign(32, MAX_SB_SIZE * MAX_SB_SIZE *
                                       sizeof(*thread_data->tmp_conv_dst)));
  CHECK_MEM_ERROR(cm, thread_data->seg_mask,
                  (uint8_t *)aom_memalign(
                      16, 2 * MAX_SB_SQUARE * sizeof(*thread_data->seg_mask)));

  for (int i = 0; i < 2; ++i) {
    CHECK_MEM_ERROR(
        cm, thread_data->tmp_obmc_bufs[i],
        aom_memalign(16, 2 * MAX_MB_PLANE * MAX_SB_SQUARE *
                             sizeof(*thread_data->tmp_obmc_bufs[i])));
  }
}